

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O2

void helper_booke206_tlbsx_ppc64(CPUPPCState_conflict2 *env,target_ulong address)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  ppcmas_tlb_t *tlb;
  uint uVar4;
  uint uVar5;
  long lVar6;
  hwaddr raddr;
  hwaddr local_38;
  
  uVar2 = env->spr[0x276];
  lVar6 = 0;
  do {
    if (lVar6 == 4) {
      uVar4 = (uint)env->spr[0x274];
      env->spr[0x272] = (ulong)(uVar4 & 0x1f);
      env->spr[0x273] = 0;
      env->spr[0x3b0] = 0;
      env->spr[0x271] =
           uVar2 & 0xffffffffffff0000 | (ulong)(((uint)uVar2 & 1) << 0xc | uVar4 & 0xf80);
      iVar3 = env->last_way;
      uVar5 = *(byte *)((long)env->spr + 0x1583) - 1 & iVar3 + 1U;
      env->last_way = uVar5;
      env->spr[0x270] = (long)(int)uVar5 | (long)(iVar3 << 0x10) | (ulong)(uVar4 & 0x30000000);
      return;
    }
    bVar1 = *(byte *)((long)env->spr + lVar6 * 8 + 0x1583);
    for (uVar5 = 0; bVar1 != uVar5; uVar5 = uVar5 + 1) {
      tlb = booke206_get_tlbm(env,(int)lVar6,address,uVar5);
      if (((tlb != (ppcmas_tlb_t *)0x0) &&
          (iVar3 = ppcmas_tlb_check(env,tlb,&local_38,address,(uint)(uVar2 >> 0x10) & 0x3fff),
          iVar3 == 0)) && (((tlb->mas1 >> 0xc ^ (uint)uVar2) & 1) == 0)) {
        booke206_tlb_to_mas(env,tlb);
        return;
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void helper_booke206_tlbsx(CPUPPCState *env, target_ulong address)
{
    ppcmas_tlb_t *tlb = NULL;
    int i, j;
    hwaddr raddr;
    uint32_t spid, sas;

    spid = (env->spr[SPR_BOOKE_MAS6] & MAS6_SPID_MASK) >> MAS6_SPID_SHIFT;
    sas = env->spr[SPR_BOOKE_MAS6] & MAS6_SAS;

    for (i = 0; i < BOOKE206_MAX_TLBN; i++) {
        int ways = booke206_tlb_ways(env, i);

        for (j = 0; j < ways; j++) {
            tlb = booke206_get_tlbm(env, i, address, j);

            if (!tlb) {
                continue;
            }

            if (ppcmas_tlb_check(env, tlb, &raddr, address, spid)) {
                continue;
            }

            if (sas != ((tlb->mas1 & MAS1_TS) >> MAS1_TS_SHIFT)) {
                continue;
            }

            booke206_tlb_to_mas(env, tlb);
            return;
        }
    }

    /* no entry found, fill with defaults */
    env->spr[SPR_BOOKE_MAS0] = env->spr[SPR_BOOKE_MAS4] & MAS4_TLBSELD_MASK;
    env->spr[SPR_BOOKE_MAS1] = env->spr[SPR_BOOKE_MAS4] & MAS4_TSIZED_MASK;
    env->spr[SPR_BOOKE_MAS2] = env->spr[SPR_BOOKE_MAS4] & MAS4_WIMGED_MASK;
    env->spr[SPR_BOOKE_MAS3] = 0;
    env->spr[SPR_BOOKE_MAS7] = 0;

    if (env->spr[SPR_BOOKE_MAS6] & MAS6_SAS) {
        env->spr[SPR_BOOKE_MAS1] |= MAS1_TS;
    }

    env->spr[SPR_BOOKE_MAS1] |= (env->spr[SPR_BOOKE_MAS6] >> 16)
        << MAS1_TID_SHIFT;

    /* next victim logic */
    env->spr[SPR_BOOKE_MAS0] |= env->last_way << MAS0_ESEL_SHIFT;
    env->last_way++;
    env->last_way &= booke206_tlb_ways(env, 0) - 1;
    env->spr[SPR_BOOKE_MAS0] |= env->last_way << MAS0_NV_SHIFT;
}